

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::Phase
          (Phase<std::complex<double>_> *this,real_type theta)

{
  double dVar1;
  
  (this->super_QGate1<std::complex<double>_>).qubit_ = 0;
  (this->super_QGate1<std::complex<double>_>).field_0xc = 0;
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cf010;
  dVar1 = ::cos(theta);
  (this->angle_).cos_ = dVar1;
  dVar1 = ::sin(theta);
  (this->angle_).sin_ = dVar1;
  return;
}

Assistant:

Phase( const real_type theta )
        : QGate1< T >( 0 )
        , angle_( theta )
        , QAdjustable( false )
        { }